

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O1

int read_var_array(coda_netcdf_product *product,int64_t *offset,int64_t num_dim_lengths,
                  int64_t *dim_length,int appendable_dim,coda_mem_record *root)

{
  size_t __size;
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  bool bVar8;
  undefined1 uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  coda_netcdf_basic_type *type;
  coda_netcdf_basic_type *type_00;
  long lVar15;
  int64_t length;
  char *pcVar16;
  uint record_var;
  ulong uVar17;
  coda_mem_record *type_01;
  ulong uVar18;
  double invalid_value;
  int32_t offset32;
  int32_t nc_type;
  int32_t tag;
  coda_mem_record *attributes;
  int64_t var_offset;
  int64_t string_length;
  int64_t num_var;
  int64_t dim_id;
  int64_t vsize;
  int64_t nelems;
  long dim [8];
  coda_conversion *local_110;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  coda_mem_record *local_f8;
  undefined8 local_f0;
  int local_e4;
  char *local_e0;
  int64_t local_d8;
  long local_d0;
  int64_t *local_c8;
  long local_c0;
  long local_b8;
  coda_mem_record *local_b0;
  long local_a8;
  long local_a0;
  int64_t local_98;
  long local_90;
  long local_88;
  ulong local_80;
  long local_78 [9];
  
  local_98 = num_dim_lengths;
  iVar11 = read_bytes(product->raw_product,*offset,4,&local_fc);
  if (iVar11 < 0) {
    return -1;
  }
  uVar9 = (undefined1)local_fc;
  uVar2 = local_fc._1_2_ << 8;
  uVar4 = local_fc._1_2_ >> 8;
  local_fc = CONCAT13(uVar9,CONCAT21(uVar2 | uVar4,local_fc._3_1_));
  *offset = *offset + 4;
  iVar11 = read_length_value(product,offset,&local_b8);
  if (iVar11 != 0) {
    return -1;
  }
  if (local_fc == 0) {
    if (local_b8 != 0) {
      pcVar14 = "invalid netCDF file (invalid value for nelems for empty var_array)";
      goto LAB_0014ef99;
    }
  }
  else {
    if (local_fc != 0xb) {
      pcVar14 = "invalid netCDF file (invalid value for NC_VARIABLE tag)";
LAB_0014ef99:
      coda_set_error(-300,pcVar14);
      return -1;
    }
    if (0 < local_b8) {
      local_a0 = (long)appendable_dim;
      local_d0 = 0;
      local_a8 = local_b8;
      local_c8 = dim_length;
      while( true ) {
        local_f8 = (coda_mem_record *)0x0;
        iVar11 = read_length_value(product,offset,&local_c0);
        lVar10 = local_c0;
        if (iVar11 != 0) {
          return -1;
        }
        __size = local_c0 + 1;
        pcVar14 = (char *)malloc(__size);
        if (pcVar14 == (char *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                         ,0x230);
          return -1;
        }
        pcVar14[lVar10] = '\0';
        iVar11 = read_bytes(product->raw_product,*offset,lVar10,pcVar14);
        if (iVar11 < 0) goto LAB_0014f068;
        uVar17 = (ulong)((uint)lVar10 & 3);
        lVar15 = ((*offset + lVar10) - uVar17) + 4;
        if (uVar17 == 0) {
          lVar15 = *offset + lVar10;
        }
        *offset = lVar15;
        iVar11 = read_length_value(product,offset,(int64_t *)&local_80);
        uVar17 = local_80;
        if (iVar11 != 0) goto LAB_0014f068;
        if ((long)local_80 < 1) {
          local_d8 = 0;
          bVar8 = true;
          record_var = 0;
          iVar11 = 0;
        }
        else {
          uVar1 = local_80 - 1;
          uVar18 = 0;
          local_e4 = 0;
          record_var = 0;
          bVar8 = false;
          local_d8 = 0;
          local_e0 = pcVar14;
          local_b0 = root;
          do {
            iVar11 = read_length_value(product,offset,&local_90);
            pcVar14 = local_e0;
            if (iVar11 != 0) goto LAB_0014f068;
            if ((local_90 < 0) || (local_98 <= local_90)) {
              coda_set_error(-300,"invalid netCDF file (invalid dimid for variable %s)",local_e0);
              goto LAB_0014f068;
            }
            if (uVar1 == uVar18) {
              local_d8 = local_c8[local_90];
              bVar8 = true;
            }
            else if (uVar18 < 8) {
              local_78[uVar18] = local_c8[local_90];
              local_e4 = local_e4 + 1;
            }
            else {
              local_78[7] = local_c8[local_90] * local_78[7];
            }
            if (uVar18 == 0) {
              record_var = (uint)(local_90 == local_a0);
            }
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
          bVar8 = !bVar8;
          root = local_b0;
          iVar11 = local_e4;
        }
        invalid_value = coda_NaN();
        local_110 = coda_conversion_new(1.0,1.0,0.0,invalid_value);
        if (local_110 == (coda_conversion *)0x0) goto LAB_0014f068;
        iVar12 = read_att_array(product,offset,&local_f8,local_110);
        if (iVar12 != 0) break;
        iVar12 = read_bytes(product->raw_product,*offset,4,&local_100);
        if (iVar12 < 0) {
LAB_0014f02e:
          coda_dynamic_type_delete((coda_dynamic_type *)local_f8);
          break;
        }
        uVar9 = (undefined1)local_100;
        uVar2 = local_100._1_2_ << 8;
        uVar4 = local_100._1_2_ >> 8;
        local_100 = CONCAT13(uVar9,CONCAT21(uVar2 | uVar4,local_100._3_1_));
        *offset = *offset + 4;
        pcVar16 = (char *)(ulong)local_100;
        if (local_100 - 7 < 0xfffffffa) {
          coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))");
          goto LAB_0014f02e;
        }
        local_e0 = pcVar16;
        if (((((local_110->numerator == 1.0) && (!NAN(local_110->numerator))) &&
             (local_110->add_offset == 0.0)) && (!NAN(local_110->add_offset))) &&
           ((local_100 - 7 < 0xfffffffe ||
            (iVar12 = coda_isNaN(local_110->invalid_value), iVar12 != 0)))) {
          coda_conversion_delete(local_110);
          local_110 = (coda_conversion *)0x0;
        }
        iVar12 = read_length_value(product,offset,&local_88);
        if (iVar12 != 0) goto LAB_0014f02e;
        if (record_var != 0) {
          product->record_size = product->record_size + local_88;
        }
        if (product->netcdf_version == 1) {
          local_e4 = iVar11;
          iVar13 = read_bytes(product->raw_product,*offset,4,&local_104);
          if (iVar13 < 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)local_f8);
            coda_conversion_delete(local_110);
            free(pcVar14);
          }
          else {
            uVar9 = (undefined1)local_104;
            uVar2 = local_104._1_2_ << 8;
            uVar4 = local_104._1_2_ >> 8;
            local_104 = CONCAT13(uVar9,CONCAT21(uVar2 | uVar4,local_104._3_1_));
            local_f0 = (long)local_104;
            *offset = *offset + 4;
          }
          iVar12 = (int)local_e0;
          iVar11 = local_e4;
          if (iVar13 < 0) {
            return -1;
          }
        }
        else {
          iVar12 = read_bytes(product->raw_product,*offset,8,&local_f0);
          if (iVar12 < 0) goto LAB_0014f02e;
          uVar2 = (ushort)local_f0 << 8;
          uVar5 = (ushort)local_f0 >> 8;
          uVar4 = local_f0._2_2_ << 8;
          uVar6 = local_f0._2_2_ >> 8;
          uVar3 = local_f0._4_2_ << 8;
          uVar7 = local_f0._4_2_ >> 8;
          local_f0 = CONCAT26(uVar2 | uVar5,
                              CONCAT24(uVar4 | uVar6,
                                       CONCAT22(uVar3 | uVar7,
                                                local_f0._6_2_ << 8 | local_f0._6_2_ >> 8)));
          *offset = *offset + 8;
          iVar12 = (int)local_e0;
        }
        if (product->file_size < local_f0) {
          coda_set_error(-300,"invalid netCDF file (invalid offset for variable %s)",pcVar14);
          goto LAB_0014f02e;
        }
        if (bVar8) {
          record_var = 0;
          length = 1;
LAB_0014ee4c:
          type = coda_netcdf_basic_type_new(iVar12,local_f0,record_var,length);
        }
        else {
          if ((iVar12 == 2) && (record_var == 0 || iVar11 != 0)) {
            iVar12 = 2;
            length = local_d8;
            goto LAB_0014ee4c;
          }
          type = coda_netcdf_basic_type_new(iVar12,local_f0,record_var,1);
          if (iVar11 < 8) {
            local_78[iVar11] = local_d8;
            iVar11 = iVar11 + 1;
          }
          else {
            local_78[7] = local_d8 * local_78[7];
          }
        }
        if ((type == (coda_netcdf_basic_type *)0x0) ||
           ((local_110 != (coda_conversion *)0x0 &&
            (iVar12 = coda_netcdf_basic_type_set_conversion(type,local_110), iVar12 != 0)))) {
          coda_dynamic_type_delete((coda_dynamic_type *)local_f8);
          break;
        }
        type_01 = local_f8;
        if (iVar11 != 0) {
          type_00 = (coda_netcdf_basic_type *)coda_netcdf_array_new(iVar11,local_78,type);
          type_01 = local_f8;
          if (type_00 == (coda_netcdf_basic_type *)0x0) {
            coda_dynamic_type_delete((coda_dynamic_type *)type);
            type_01 = local_f8;
          }
          else {
            if ((local_f8 == (coda_mem_record *)0x0) ||
               (iVar11 = coda_netcdf_array_set_attributes((coda_netcdf_array *)type_00,local_f8),
               iVar11 == 0)) goto LAB_0014eefa;
            coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          }
LAB_0014f0ad:
          coda_dynamic_type_delete((coda_dynamic_type *)type_01);
          goto LAB_0014f068;
        }
        type_00 = type;
        if ((local_f8 != (coda_mem_record *)0x0) &&
           (iVar11 = coda_netcdf_basic_type_set_attributes(type,local_f8), iVar11 != 0)) {
          coda_dynamic_type_delete((coda_dynamic_type *)type);
          goto LAB_0014f0ad;
        }
LAB_0014eefa:
        iVar11 = coda_mem_record_add_field(root,pcVar14,(coda_dynamic_type *)type_00,1);
        lVar10 = local_d0;
        if (iVar11 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          goto LAB_0014f068;
        }
        free(pcVar14);
        local_d0 = lVar10 + 1;
        if (local_d0 == local_a8) {
          return 0;
        }
      }
      coda_conversion_delete(local_110);
LAB_0014f068:
      free(pcVar14);
      return -1;
    }
  }
  return 0;
}

Assistant:

static int read_var_array(coda_netcdf_product *product, int64_t *offset, int64_t num_dim_lengths, int64_t *dim_length,
                          int appendable_dim, coda_mem_record *root)
{
    int32_t tag;
    int64_t num_var;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_var) != 0)
    {
        return -1;
    }

    if (tag == 0)
    {
        if (num_var != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty var_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 11)      /* NC_VARIABLE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_VARIABLE tag)");
        return -1;
    }

    for (i = 0; i < num_var; i++)
    {
        coda_netcdf_basic_type *basic_type;
        coda_mem_record *attributes = NULL;
        coda_conversion *conversion;
        long dim[CODA_MAX_NUM_DIMS];
        int64_t var_offset;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        int64_t vsize;
        int64_t dim_id;
        char *name;
        long last_dim_length = 0;
        int last_dim_set = 0;
        int record_var = 0;
        int num_dims;
        long j;

        if (read_length_value(product, offset, &string_length) != 0)
        {
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            return -1;
        }
        num_dims = 0;
        for (j = 0; j < nelems; j++)
        {
            /* dimid */
            if (read_length_value(product, offset, &dim_id) != 0)
            {
                free(name);
                return -1;
            }
            if (dim_id < 0 || dim_id >= num_dim_lengths)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid dimid for variable %s)", name);
                free(name);
                return -1;
            }
            if (j == nelems - 1)
            {
                last_dim_length = (long)dim_length[dim_id];
                last_dim_set = 1;
            }
            else
            {
                if (j < CODA_MAX_NUM_DIMS)
                {
                    dim[j] = (long)dim_length[dim_id];
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= (long)dim_length[dim_id];
                }
            }
            if (j == 0)
            {
                record_var = (dim_id == appendable_dim);
            }
        }

        conversion = coda_conversion_new(1.0, 1.0, 0.0, coda_NaN());
        if (conversion == NULL)
        {
            free(name);
            return -1;
        }
        /* vatt_array */
        if (read_att_array(product, offset, &attributes, conversion) != 0)
        {
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }

        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        if (nc_type < 1 || nc_type > 6)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;

        }

        /* check if we need to use a conversion */
        if (conversion->numerator == 1.0 && conversion->add_offset == 0.0)
        {
            /* don't create conversions for non-floating type data if we only have an 'invalid_value' attribute */
            if ((nc_type != 5 && nc_type != 6) || coda_isNaN(conversion->invalid_value))
            {
                coda_conversion_delete(conversion);
                conversion = NULL;
            }
        }

        /* vsize */
        if (read_length_value(product, offset, &vsize) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (record_var)
        {
            product->record_size += (long)vsize;
        }

        /* offset */
        if (product->netcdf_version == 1)
        {
            int32_t offset32;

            if (read_bytes(product->raw_product, *offset, 4, &offset32) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&offset32);
#endif
            var_offset = (int64_t)offset32;
            *offset += 4;
        }
        else
        {
            if (read_bytes(product->raw_product, *offset, 8, &var_offset) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int64(&var_offset);
#endif
            *offset += 8;
        }
        if (var_offset > product->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid offset for variable %s)", name);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (last_dim_set)
        {
            if (nc_type == 2 && !(num_dims == 0 && record_var))
            {
                /* we treat the last dimension of a char array as a string */
                /* except if it is a one dimensional char array where the first dimension is the appendable dimension */
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, last_dim_length);
            }
            else
            {
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, 1);
                if (num_dims < CODA_MAX_NUM_DIMS)
                {
                    dim[num_dims] = last_dim_length;
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= last_dim_length;
                }
            }
        }
        else
        {
            /* we only get here if the variable is a real scalar (num_dims == 0) */
            basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (conversion != NULL)
        {
            if (coda_netcdf_basic_type_set_conversion(basic_type, conversion) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
        }
        if (num_dims == 0)
        {
            if (attributes != NULL)
            {
                if (coda_netcdf_basic_type_set_attributes(basic_type, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;

            array = coda_netcdf_array_new(num_dims, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                free(name);
                return -1;
            }
            if (attributes != NULL)
            {
                if (coda_netcdf_array_set_attributes(array, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)array);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}